

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_highbd_dc_top_predictor_8x8_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  int iVar10;
  undefined4 uVar11;
  undefined1 auVar12 [16];
  
  uVar1 = *(ulong *)above;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_2_ = (short)(uVar1 >> 0x30);
  auVar6._8_2_ = (short)(uVar1 >> 0x20);
  auVar6._0_8_ = uVar1;
  auVar6._10_4_ = auVar4._10_4_;
  auVar8._6_8_ = 0;
  auVar8._0_6_ = auVar6._8_6_;
  uVar2 = *(ulong *)(above + 4);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar2;
  auVar3._12_2_ = (short)(uVar2 >> 0x30);
  auVar5._8_2_ = (short)(uVar2 >> 0x20);
  auVar5._0_8_ = uVar2;
  auVar5._10_4_ = auVar3._10_4_;
  auVar9._6_8_ = 0;
  auVar9._0_6_ = auVar5._8_6_;
  auVar7._4_2_ = (short)(uVar2 >> 0x10);
  auVar7._0_4_ = (uint)uVar2;
  auVar7._6_8_ = SUB148(auVar9 << 0x40,6);
  auVar12 = ZEXT416((auVar3._10_4_ >> 0x10) + (auVar4._10_4_ >> 0x10) +
                    auVar7._4_4_ + (int)CONCAT82(SUB148(auVar8 << 0x40,6),(short)(uVar1 >> 0x10)) +
                    auVar5._8_4_ + auVar6._8_4_ + ((uint)uVar2 & 0xffff) + (uint)(ushort)uVar1 + 4
                    >> 3);
  auVar12 = pshuflw(auVar12,auVar12,0);
  uVar11 = auVar12._0_4_;
  iVar10 = 8;
  do {
    *(undefined4 *)dst = uVar11;
    *(undefined4 *)(dst + 2) = uVar11;
    *(undefined4 *)(dst + 4) = uVar11;
    *(undefined4 *)(dst + 6) = uVar11;
    dst = dst + stride;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  return;
}

Assistant:

static inline void highbd_dc_top_predictor(uint16_t *dst, ptrdiff_t stride,
                                           int bw, int bh,
                                           const uint16_t *above,
                                           const uint16_t *left, int bd) {
  int i, r, expected_dc, sum = 0;
  (void)left;
  (void)bd;

  for (i = 0; i < bw; i++) sum += above[i];
  expected_dc = (sum + (bw >> 1)) / bw;

  for (r = 0; r < bh; r++) {
    aom_memset16(dst, expected_dc, bw);
    dst += stride;
  }
}